

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cpp
# Opt level: O2

Error * __thiscall
Worker::parse_and_validate_json_request(Error *__return_storage_ptr__,Worker *this,string *request)

{
  bool bVar1;
  char *pcVar2;
  ValueIterator value;
  ValueIterator pGVar3;
  Task *this_00;
  ValueType *json_task;
  Task *task;
  Document document;
  Data local_b8 [2];
  Task *local_98;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  local_90;
  
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&local_90,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::Parse<0u,rapidjson::UTF8<char>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)&local_90,(request->_M_dataplus)._M_p);
  if (local_90.parseResult_.code_ == kParseErrorNone) {
    bVar1 = SchemaValidator::validate
                      ((this->request_validator_)._M_t.
                       super___uniq_ptr_impl<SchemaValidator,_std::default_delete<SchemaValidator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_SchemaValidator_*,_std::default_delete<SchemaValidator>_>
                       .super__Head_base<0UL,_SchemaValidator_*,_false>._M_head_impl,&local_90);
    if (bVar1) {
      if ((this->tasks_).super__Vector_base<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (this->tasks_).super__Vector_base<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("tasks_.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/src/worker.cpp"
                      ,0xa8,"Error Worker::parse_and_validate_json_request(const std::string &)");
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      operator[]<char_const>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)&local_90,"tasks");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GetArray((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_b8[0].s);
      value = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::Begin((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_b8[0]._0_8_);
      pGVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::End((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_b8[0]._0_8_);
      for (; value != pGVar3; value = value + 1) {
        this_00 = (Task *)operator_new(0x118);
        memset(this_00,0,0x118);
        libsbox::Task::Task(this_00);
        local_98 = this_00;
        libsbox::Task::
        deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                  (this_00,value);
        std::vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>::push_back
                  (&this->tasks_,&local_98);
      }
      (__return_storage_ptr__->error_).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->error_).field_2 + 8) = 0;
      (__return_storage_ptr__->error_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->error_).field_2;
      (__return_storage_ptr__->error_)._M_string_length = 0;
      goto LAB_001127cc;
    }
    SchemaValidator::get_error_abi_cxx11_
              ((string *)&local_b8[0].s,
               (this->request_validator_)._M_t.
               super___uniq_ptr_impl<SchemaValidator,_std::default_delete<SchemaValidator>_>._M_t.
               super__Tuple_impl<0UL,_SchemaValidator_*,_std::default_delete<SchemaValidator>_>.
               super__Head_base<0UL,_SchemaValidator_*,_false>._M_head_impl);
    Error::Error(__return_storage_ptr__,(string *)&local_b8[0].s);
  }
  else {
    pcVar2 = rapidjson::GetParseError_En(local_90.parseResult_.code_);
    format_abi_cxx11_((string *)&local_b8[0].s,"Request JSON incorrect: %s (at %zi)",pcVar2,
                      local_90.parseResult_.offset_);
    Error::Error(__return_storage_ptr__,(string *)&local_b8[0].s);
  }
  std::__cxx11::string::~string((string *)&local_b8[0].s);
LAB_001127cc:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&local_90);
  return __return_storage_ptr__;
}

Assistant:

Error Worker::parse_and_validate_json_request(const std::string &request) {
    rapidjson::Document document;
    document.Parse(request.c_str());

    if (document.HasParseError()) {
        return Error(format(
            "Request JSON incorrect: %s (at %zi)",
            GetParseError_En(document.GetParseError()),
            document.GetErrorOffset()
        ));
    }

    if (!request_validator_->validate(document)) {
        return Error(request_validator_->get_error());
    }

    assert(tasks_.empty());

    for (const auto &json_task : document["tasks"].GetArray()) {
        libsbox::Task *task = new libsbox::Task();
        task->deserialize_request(json_task);
        tasks_.push_back(task);
    }

    return Error();
}